

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_transform_base.h
# Opt level: O2

bool __thiscall
draco::PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
          (PredictionSchemeWrapTransformBase<int> *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (long)this->max_value_ - (long)this->min_value_;
  if (uVar1 < 0x7fffffff) {
    uVar2 = (int)uVar1 + 1;
    this->max_dif_ = uVar2;
    uVar2 = uVar2 >> 1;
    this->max_correction_ = uVar2;
    this->min_correction_ = -uVar2;
    if ((uVar1 & 1) != 0) {
      this->max_correction_ = uVar2 - 1;
    }
  }
  return uVar1 < 0x7fffffff;
}

Assistant:

bool InitCorrectionBounds() {
    const int64_t dif =
        static_cast<int64_t>(max_value_) - static_cast<int64_t>(min_value_);
    if (dif < 0 || dif >= std::numeric_limits<DataTypeT>::max()) {
      return false;
    }
    max_dif_ = 1 + static_cast<DataTypeT>(dif);
    max_correction_ = max_dif_ / 2;
    min_correction_ = -max_correction_;
    if ((max_dif_ & 1) == 0) {
      max_correction_ -= 1;
    }
    return true;
  }